

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jieba.hpp
# Opt level: O0

void __thiscall
cppjieba::Jieba::Jieba
          (Jieba *this,string *dict_path,string *model_path,string *user_dict_path,string *idfPath,
          string *stopWordPath)

{
  string *in_RDX;
  HMMModel *in_RSI;
  HMMModel *in_RDI;
  HMMModel *in_stack_ffffffffffffff78;
  FullSegment *in_stack_ffffffffffffff80;
  DictTrie *in_stack_ffffffffffffff88;
  MPSegment *in_stack_ffffffffffffff90;
  HMMModel *model;
  DictTrie *dictTrie;
  HMMModel *model_00;
  HMMModel *model_01;
  string *in_stack_ffffffffffffffb8;
  DictTrie *dictTrie_00;
  KeywordExtractor *in_stack_ffffffffffffffc0;
  
  model_01 = in_RDI;
  DictTrie::DictTrie((DictTrie *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
                     (string *)in_RDI,(UserWordWeightOption)((ulong)in_RDI >> 0x20));
  dictTrie_00 = (DictTrie *)&(model_01->emitProbB)._M_h._M_rehash_policy._M_next_resize;
  HMMModel::HMMModel(in_RSI,in_RDX);
  model_00 = (HMMModel *)&in_RDI[1].emitProbB._M_h._M_rehash_policy._M_next_resize;
  MPSegment::MPSegment(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  dictTrie = (DictTrie *)&in_RDI[1].emitProbM._M_h._M_bucket_count;
  HMMSegment::HMMSegment((HMMSegment *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  model = (HMMModel *)&in_RDI[1].emitProbS._M_h._M_rehash_policy;
  MixSegment::MixSegment((MixSegment *)model_01,(DictTrie *)in_RDI,model_00);
  FullSegment::FullSegment(in_stack_ffffffffffffff80,(DictTrie *)in_stack_ffffffffffffff78);
  QuerySegment::QuerySegment((QuerySegment *)model_00,dictTrie,model);
  KeywordExtractor::KeywordExtractor
            (in_stack_ffffffffffffffc0,dictTrie_00,model_01,(string *)in_RDI,(string *)model_00);
  return;
}

Assistant:

Jieba(const string& dict_path, 
        const string& model_path,
        const string& user_dict_path, 
        const string& idfPath, 
        const string& stopWordPath) 
    : dict_trie_(dict_path, user_dict_path),
      model_(model_path),
      mp_seg_(&dict_trie_),
      hmm_seg_(&model_),
      mix_seg_(&dict_trie_, &model_),
      full_seg_(&dict_trie_),
      query_seg_(&dict_trie_, &model_),
      extractor(&dict_trie_, &model_, idfPath, stopWordPath) {
  }